

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O0

redisContext * redisConnectWithOptions(redisOptions *options)

{
  redisContext *c;
  redisOptions *options_local;
  
  options_local = (redisOptions *)redisContextInit(options);
  if ((redisContext *)options_local == (redisContext *)0x0) {
    options_local = (redisOptions *)0x0;
  }
  else {
    if ((options->options & 1U) == 0) {
      ((redisContext *)options_local)->flags = ((redisContext *)options_local)->flags | 1;
    }
    if ((options->options & 2U) != 0) {
      ((redisContext *)options_local)->flags = ((redisContext *)options_local)->flags | 0x80;
    }
    if ((options->options & 4U) != 0) {
      ((redisContext *)options_local)->flags = ((redisContext *)options_local)->flags | 0x200;
    }
    if (options->type == 0) {
      redisContextConnectBindTcp
                ((redisContext *)options_local,(options->endpoint).tcp.ip,
                 (options->endpoint).tcp.port,options->timeout,(options->endpoint).tcp.source_addr);
    }
    else if (options->type == 1) {
      redisContextConnectUnix
                ((redisContext *)options_local,(options->endpoint).tcp.source_addr,options->timeout)
      ;
    }
    else {
      if (options->type != 2) {
        return (redisContext *)0x0;
      }
      ((redisContext *)options_local)->fd = (options->endpoint).fd;
      ((redisContext *)options_local)->flags = ((redisContext *)options_local)->flags | 2;
    }
    if (((options->timeout != (timeval *)0x0) &&
        ((((redisContext *)options_local)->flags & 1U) != 0)) &&
       (((redisContext *)options_local)->fd != -1)) {
      redisContextSetTimeout((redisContext *)options_local,*options->timeout);
    }
  }
  return (redisContext *)options_local;
}

Assistant:

redisContext *redisConnectWithOptions(const redisOptions *options) {
    redisContext *c = redisContextInit(options);
    if (c == NULL) {
        return NULL;
    }
    if (!(options->options & REDIS_OPT_NONBLOCK)) {
        c->flags |= REDIS_BLOCK;
    }
    if (options->options & REDIS_OPT_REUSEADDR) {
        c->flags |= REDIS_REUSEADDR;
    }
    if (options->options & REDIS_OPT_NOAUTOFREE) {
      c->flags |= REDIS_NO_AUTO_FREE;
    }

    if (options->type == REDIS_CONN_TCP) {
        redisContextConnectBindTcp(c, options->endpoint.tcp.ip,
                                   options->endpoint.tcp.port, options->timeout,
                                   options->endpoint.tcp.source_addr);
    } else if (options->type == REDIS_CONN_UNIX) {
        redisContextConnectUnix(c, options->endpoint.unix_socket,
                                options->timeout);
    } else if (options->type == REDIS_CONN_USERFD) {
        c->fd = options->endpoint.fd;
        c->flags |= REDIS_CONNECTED;
    } else {
        // Unknown type - FIXME - FREE
        return NULL;
    }
    if (options->timeout != NULL && (c->flags & REDIS_BLOCK) && c->fd != REDIS_INVALID_FD) {
        redisContextSetTimeout(c, *options->timeout);
    }
    return c;
}